

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall Am_Widget_Look::TypeError(Am_Widget_Look *this,Am_Value *in_value)

{
  Am_Error();
}

Assistant:

void
Am_Widget_Look::TypeError(Am_Value const &in_value)
{
  DERR("** Tried to set a "
       "Am_Widget_Look"
       " enum with a non "
       "Am_Widget_Look"
       " wrapper: "
       << in_value << std::endl);
  Am_Error();
}